

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O2

ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> * __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::GetReleaseQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  *this,SoftwareQueueIndex QueueInd)

{
  char (*in_RCX) [27];
  string msg;
  string local_38;
  
  if (this->m_CmdQueueCount <= (ulong)QueueInd.m_Value) {
    FormatString<char[26],char[27]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x6dc2ad,in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetReleaseQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0xf0);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return &this->m_CommandQueues[QueueInd.m_Value].ReleaseQueue;
}

Assistant:

ResourceReleaseQueue<DynamicStaleResourceWrapper>& GetReleaseQueue(SoftwareQueueIndex QueueInd)
    {
        VERIFY_EXPR(QueueInd < m_CmdQueueCount);
        return m_CommandQueues[QueueInd].ReleaseQueue;
    }